

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O2

string * __thiscall
LPCMStreamReader::getStreamInfo_abi_cxx11_(string *__return_storage_ptr__,LPCMStreamReader *this)

{
  ostream *poVar1;
  ostringstream str;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
  poVar1 = std::operator<<((ostream *)&str,"Bitrate: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"Kbps  ");
  poVar1 = std::operator<<((ostream *)&str,"Sample Rate: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_freq / 1000);
  std::operator<<(poVar1,"KHz  ");
  std::operator<<((ostream *)&str,"Channels: ");
  if (this->m_lfeExists == true) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&str,this->m_channels - 1);
    std::operator<<(poVar1,".1");
  }
  else {
    std::ostream::operator<<((ostream *)&str,(uint)this->m_channels);
  }
  poVar1 = std::operator<<((ostream *)&str,"  Bits per sample: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_bitsPerSample);
  std::operator<<(poVar1,"bit");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
  return __return_storage_ptr__;
}

Assistant:

const std::string LPCMStreamReader::getStreamInfo()
{
    std::ostringstream str;
    const int mch = m_channels + (m_channels % 2 == 1 ? 1 : 0);
    const uint32_t bitrate = (m_bitsPerSample == 20 ? 24 : m_bitsPerSample) * m_freq * mch;
    str << "Bitrate: " << bitrate / 1000 << "Kbps  ";
    str << "Sample Rate: " << m_freq / 1000 << "KHz  ";
    str << "Channels: ";
    if (m_lfeExists)
        str << static_cast<int>(m_channels) - 1 << ".1";
    else
        str << static_cast<int>(m_channels);
    str << "  Bits per sample: " << m_bitsPerSample << "bit";
    return str.str();
}